

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Lcorr(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  char *pcVar6;
  Cec_ParCor_t Pars;
  Cec_ParCor_t local_88;
  
  Cec_ManCorSetDefaultParams(&local_88);
  local_88.fLatchCorr = 1;
  Extra_UtilGetoptReset();
  pcVar6 = "Command line switch \"-P\" should be followed by an integer.\n";
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FCPrcvwh"), iVar3 = globalUtilOptind, 0x62 < iVar1) {
      if (iVar1 < 0x76) {
        if (iVar1 == 99) {
          local_88.fUseCSat = local_88.fUseCSat ^ 1;
        }
        else {
          if (iVar1 != 0x72) goto LAB_0027f2ad;
          local_88.fUseRings = local_88.fUseRings ^ 1;
        }
      }
      else if (iVar1 == 0x76) {
        local_88.fVerbose = local_88.fVerbose ^ 1;
      }
      else {
        if (iVar1 != 0x77) goto LAB_0027f2ad;
        local_88.fVerboseFlops = local_88.fVerboseFlops ^ 1;
      }
    }
    if (iVar1 < 0x46) {
      if (iVar1 != 0x43) {
        if (iVar1 == -1) {
          if (pAbc->pGia != (Gia_Man_t *)0x0) {
            iVar3 = Gia_ManBoxNum(pAbc->pGia);
            if ((iVar3 == 0) || (iVar3 = Gia_ManRegBoxNum(pAbc->pGia), iVar3 == 0)) {
              if (pAbc->pGia->nRegs == 0) {
                Abc_Print(-1,"The network is combinational.\n");
                return 0;
              }
              pGVar4 = Cec_ManLSCorrespondence(pAbc->pGia,&local_88);
              Abc_FrameUpdateGia(pAbc,pGVar4);
            }
            else {
              if (pAbc->pGia->pAigExtra != (Gia_Man_t *)0x0) {
                pGVar4 = Gia_ManSweepWithBoxes
                                   (pAbc->pGia,(void *)0x0,&local_88,0,0,local_88.fVerbose,
                                    local_88.fVerboseFlops);
                Abc_FrameUpdateGia(pAbc,pGVar4);
                return 0;
              }
              puts("Timing manager is given but there is no GIA of boxes.");
            }
            return 0;
          }
          pcVar6 = "Abc_CommandAbc9Lcorr(): There is no AIG.\n";
          iVar3 = -1;
          goto LAB_0027f3ae;
        }
        goto LAB_0027f2ad;
      }
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-C\" should be followed by an integer.\n";
        goto LAB_0027f29e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88.nBTLimit = uVar2;
    }
    else if (iVar1 == 0x46) {
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0027f29e;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88.nFrames = uVar2;
    }
    else {
      if (iVar1 != 0x50) goto LAB_0027f2ad;
      if (argc <= globalUtilOptind) {
LAB_0027f29e:
        Abc_Print(-1,pcVar6);
        goto LAB_0027f2ad;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88.nPrefix = uVar2;
    }
    globalUtilOptind = iVar3 + 1;
    if ((int)uVar2 < 0) {
LAB_0027f2ad:
      Abc_Print(-2,"usage: &lcorr [-FCP num] [-rcvwh]\n");
      Abc_Print(-2,"\t         performs latch correpondence computation\n");
      Abc_Print(-2,"\t-C num : the max number of conflicts at a node [default = %d]\n",
                (ulong)(uint)local_88.nBTLimit);
      Abc_Print(-2,"\t-F num : the number of timeframes in inductive case [default = %d]\n",
                (ulong)(uint)local_88.nFrames);
      Abc_Print(-2,"\t-P num : the number of timeframes in the prefix [default = %d]\n",
                (ulong)(uint)local_88.nPrefix);
      pcVar5 = "yes";
      pcVar6 = "yes";
      if (local_88.fUseRings == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle using implication rings during refinement [default = %s]\n",
                pcVar6);
      pcVar6 = "yes";
      if (local_88.fUseCSat == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle using circuit-based SAT solver [default = %s]\n",pcVar6);
      pcVar6 = "yes";
      if (local_88.fVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      if (local_88.fVerboseFlops == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n"
                ,pcVar5);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_0027f3ae:
      Abc_Print(iVar3,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Lcorr( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Cec_ParCor_t Pars, * pPars = &Pars;
    Gia_Man_t * pTemp;
    int c;
    Cec_ManCorSetDefaultParams( pPars );
    pPars->fLatchCorr = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FCPrcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBTLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBTLimit < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPrefix = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPrefix < 0 )
                goto usage;
            break;
        case 'r':
            pPars->fUseRings ^= 1;
            break;
        case 'c':
            pPars->fUseCSat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVerboseFlops ^= 1;
            break;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Lcorr(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManBoxNum(pAbc->pGia) && Gia_ManRegBoxNum(pAbc->pGia) )
    {
        if ( pAbc->pGia->pAigExtra == NULL )
        {
            printf( "Timing manager is given but there is no GIA of boxes.\n" );
            return 0;
        }
        pTemp = Gia_ManSweepWithBoxes( pAbc->pGia, NULL, pPars, 0, 0, pPars->fVerbose, pPars->fVerboseFlops );
        Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    pTemp = Cec_ManLSCorrespondence( pAbc->pGia, pPars );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &lcorr [-FCP num] [-rcvwh]\n" );
    Abc_Print( -2, "\t         performs latch correpondence computation\n" );
    Abc_Print( -2, "\t-C num : the max number of conflicts at a node [default = %d]\n", pPars->nBTLimit );
    Abc_Print( -2, "\t-F num : the number of timeframes in inductive case [default = %d]\n", pPars->nFrames );
    Abc_Print( -2, "\t-P num : the number of timeframes in the prefix [default = %d]\n", pPars->nPrefix );
    Abc_Print( -2, "\t-r     : toggle using implication rings during refinement [default = %s]\n", pPars->fUseRings? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle using circuit-based SAT solver [default = %s]\n", pPars->fUseCSat? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose info about equivalent flops [default = %s]\n", pPars->fVerboseFlops? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}